

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_examples.c
# Opt level: O0

int main(void)

{
  int iVar1;
  
  UnityBegin(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/deps/cJSON/tests/parse_examples.c"
            );
  UnityDefaultTestRun(file_test1_should_be_parsed_and_printed,
                      "file_test1_should_be_parsed_and_printed",0x100);
  UnityDefaultTestRun(file_test2_should_be_parsed_and_printed,
                      "file_test2_should_be_parsed_and_printed",0x101);
  UnityDefaultTestRun(file_test3_should_be_parsed_and_printed,
                      "file_test3_should_be_parsed_and_printed",0x102);
  UnityDefaultTestRun(file_test4_should_be_parsed_and_printed,
                      "file_test4_should_be_parsed_and_printed",0x103);
  UnityDefaultTestRun(file_test5_should_be_parsed_and_printed,
                      "file_test5_should_be_parsed_and_printed",0x104);
  UnityDefaultTestRun(file_test6_should_not_be_parsed,"file_test6_should_not_be_parsed",0x105);
  UnityDefaultTestRun(file_test7_should_be_parsed_and_printed,
                      "file_test7_should_be_parsed_and_printed",0x106);
  UnityDefaultTestRun(file_test8_should_be_parsed_and_printed,
                      "file_test8_should_be_parsed_and_printed",0x107);
  UnityDefaultTestRun(file_test9_should_be_parsed_and_printed,
                      "file_test9_should_be_parsed_and_printed",0x108);
  UnityDefaultTestRun(file_test10_should_be_parsed_and_printed,
                      "file_test10_should_be_parsed_and_printed",0x109);
  UnityDefaultTestRun(file_test11_should_be_parsed_and_printed,
                      "file_test11_should_be_parsed_and_printed",0x10a);
  UnityDefaultTestRun(test12_should_not_be_parsed,"test12_should_not_be_parsed",0x10b);
  UnityDefaultTestRun(test13_should_be_parsed_without_null_termination,
                      "test13_should_be_parsed_without_null_termination",0x10c);
  UnityDefaultTestRun(test14_should_not_be_parsed,"test14_should_not_be_parsed",0x10d);
  iVar1 = UnityEnd();
  return iVar1;
}

Assistant:

main(void)
{
    UNITY_BEGIN();
    RUN_TEST(file_test1_should_be_parsed_and_printed);
    RUN_TEST(file_test2_should_be_parsed_and_printed);
    RUN_TEST(file_test3_should_be_parsed_and_printed);
    RUN_TEST(file_test4_should_be_parsed_and_printed);
    RUN_TEST(file_test5_should_be_parsed_and_printed);
    RUN_TEST(file_test6_should_not_be_parsed);
    RUN_TEST(file_test7_should_be_parsed_and_printed);
    RUN_TEST(file_test8_should_be_parsed_and_printed);
    RUN_TEST(file_test9_should_be_parsed_and_printed);
    RUN_TEST(file_test10_should_be_parsed_and_printed);
    RUN_TEST(file_test11_should_be_parsed_and_printed);
    RUN_TEST(test12_should_not_be_parsed);
    RUN_TEST(test13_should_be_parsed_without_null_termination);
    RUN_TEST(test14_should_not_be_parsed);
    return UNITY_END();
}